

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundogroup.cpp
# Opt level: O0

void __thiscall QUndoGroup::removeStack(QUndoGroup *this,QUndoStack *stack)

{
  long lVar1;
  QUndoGroupPrivate *this_00;
  qsizetype qVar2;
  QUndoStackPrivate *pQVar3;
  QUndoStack *in_RSI;
  QUndoGroup *in_RDI;
  long in_FS_OFFSET;
  QUndoGroupPrivate *d;
  QUndoGroup *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QUndoGroup *)0xa8878e);
  qVar2 = QList<QUndoStack*>::removeAll<QUndoStack*>
                    ((QList<QUndoStack_*> *)this_00,(QUndoStack **)in_RDI);
  if (qVar2 != 0) {
    if (in_RSI == this_00->active) {
      setActiveStack(this_01,(QUndoStack *)this_00);
    }
    pQVar3 = QUndoStack::d_func((QUndoStack *)0xa887d8);
    pQVar3->group = (QUndoGroup *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUndoGroup::removeStack(QUndoStack *stack)
{
    Q_D(QUndoGroup);

    if (d->stack_list.removeAll(stack) == 0)
        return;
    if (stack == d->active)
        setActiveStack(nullptr);
    stack->d_func()->group = nullptr;
}